

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_YAFluxRegister.cpp
# Opt level: O0

void __thiscall
amrex::YAFluxRegister::YAFluxRegister
          (YAFluxRegister *this,BoxArray *fba,BoxArray *cba,DistributionMapping *fdm,
          DistributionMapping *cdm,Geometry *fgeom,Geometry *cgeom,IntVect *ref_ratio,int fine_lev,
          int nvar)

{
  long in_RDI;
  Geometry *in_stack_000009d0;
  DistributionMapping *in_stack_000009d8;
  DistributionMapping *in_stack_000009e0;
  BoxArray *in_stack_000009e8;
  BoxArray *in_stack_000009f0;
  YAFluxRegister *in_stack_000009f8;
  Geometry *in_stack_00000a70;
  IntVect *in_stack_00000a78;
  int in_stack_00000a80;
  int in_stack_00000a88;
  Geometry *in_stack_ffffffffffffff60;
  
  MultiFab::MultiFab((MultiFab *)in_stack_ffffffffffffff60);
  iMultiFab::iMultiFab((iMultiFab *)in_stack_ffffffffffffff60);
  Vector<int,_std::allocator<int>_>::Vector((Vector<int,_std::allocator<int>_> *)0x16362dc);
  MultiFab::MultiFab((MultiFab *)in_stack_ffffffffffffff60);
  MultiFab::MultiFab((MultiFab *)in_stack_ffffffffffffff60);
  Vector<amrex::Vector<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_>,_std::allocator<amrex::Vector<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_>_>_>
  ::Vector((Vector<amrex::Vector<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_>,_std::allocator<amrex::Vector<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_>_>_>
            *)0x163631e);
  Vector<int,_std::allocator<int>_>::Vector((Vector<int,_std::allocator<int>_> *)0x1636334);
  Geometry::Geometry(in_stack_ffffffffffffff60);
  Geometry::Geometry(in_stack_ffffffffffffff60);
  IntVect::IntVect((IntVect *)(in_RDI + 0x7d8));
  define(in_stack_000009f8,in_stack_000009f0,in_stack_000009e8,in_stack_000009e0,in_stack_000009d8,
         in_stack_000009d0,in_stack_00000a70,in_stack_00000a78,in_stack_00000a80,in_stack_00000a88);
  return;
}

Assistant:

YAFluxRegister::YAFluxRegister (const BoxArray& fba, const BoxArray& cba,
                                const DistributionMapping& fdm, const DistributionMapping& cdm,
                                const Geometry& fgeom, const Geometry& cgeom,
                                const IntVect& ref_ratio, int fine_lev, int nvar)
{
    define(fba, cba, fdm, cdm, fgeom, cgeom, ref_ratio, fine_lev, nvar);
}